

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_hkdf.cc
# Opt level: O1

int pkey_hkdf_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  void *pvVar4;
  uint8_t *data;
  size_t len;
  uint uVar5;
  
  iVar3 = pkey_hkdf_init(dst);
  uVar5 = 0;
  if (iVar3 != 0) {
    puVar1 = (undefined4 *)dst->data;
    puVar2 = (undefined4 *)src->data;
    *puVar1 = *puVar2;
    *(undefined8 *)(puVar1 + 2) = *(undefined8 *)(puVar2 + 2);
    if (*(size_t *)(puVar2 + 6) != 0) {
      pvVar4 = OPENSSL_memdup(*(void **)(puVar2 + 4),*(size_t *)(puVar2 + 6));
      *(void **)(puVar1 + 4) = pvVar4;
      if (pvVar4 == (void *)0x0) {
        return 0;
      }
      *(undefined8 *)(puVar1 + 6) = *(undefined8 *)(puVar2 + 6);
    }
    if (*(size_t *)(puVar2 + 10) != 0) {
      pvVar4 = OPENSSL_memdup(*(void **)(puVar2 + 8),*(size_t *)(puVar2 + 10));
      *(void **)(puVar1 + 8) = pvVar4;
      if (pvVar4 == (void *)0x0) {
        return 0;
      }
      *(undefined8 *)(puVar1 + 10) = *(undefined8 *)(puVar2 + 10);
    }
    data = CBB_data((CBB *)(puVar2 + 0xc));
    len = CBB_len((CBB *)(puVar2 + 0xc));
    iVar3 = CBB_add_bytes((CBB *)(puVar1 + 0xc),data,len);
    uVar5 = (uint)(iVar3 != 0);
  }
  return uVar5;
}

Assistant:

static int pkey_hkdf_copy(EVP_PKEY_CTX *dst, EVP_PKEY_CTX *src) {
  if (!pkey_hkdf_init(dst)) {
    return 0;
  }

  HKDF_PKEY_CTX *hctx_dst = reinterpret_cast<HKDF_PKEY_CTX *>(dst->data);
  const HKDF_PKEY_CTX *hctx_src =
      reinterpret_cast<const HKDF_PKEY_CTX *>(src->data);
  hctx_dst->mode = hctx_src->mode;
  hctx_dst->md = hctx_src->md;

  if (hctx_src->key_len != 0) {
    hctx_dst->key = reinterpret_cast<uint8_t *>(
        OPENSSL_memdup(hctx_src->key, hctx_src->key_len));
    if (hctx_dst->key == NULL) {
      return 0;
    }
    hctx_dst->key_len = hctx_src->key_len;
  }

  if (hctx_src->salt_len != 0) {
    hctx_dst->salt = reinterpret_cast<uint8_t *>(
        OPENSSL_memdup(hctx_src->salt, hctx_src->salt_len));
    if (hctx_dst->salt == NULL) {
      return 0;
    }
    hctx_dst->salt_len = hctx_src->salt_len;
  }

  if (!CBB_add_bytes(&hctx_dst->info, CBB_data(&hctx_src->info),
                     CBB_len(&hctx_src->info))) {
    return 0;
  }

  return 1;
}